

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCircuit.hpp
# Opt level: O3

bool __thiscall
qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::equals
          (QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *this,
          QObject<std::complex<float>_> *other)

{
  float *pfVar1;
  float fVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  long local_28;
  void *local_20;
  long local_18;
  void *local_10;
  
  (*other->_vptr_QObject[7])(&local_28);
  (*(this->super_QObject<std::complex<float>_>)._vptr_QObject[7])(&local_18,this);
  if (local_18 == local_28) {
    if (0 < local_18) {
      lVar4 = (long)local_20 + 4;
      lVar3 = (long)local_10 + 4;
      lVar7 = 0;
      bVar5 = false;
      do {
        lVar8 = 0;
        do {
          fVar2 = *(float *)(lVar3 + -4 + lVar8 * 8);
          pfVar1 = (float *)(lVar4 + -4 + lVar8 * 8);
          bVar6 = false;
          if ((((fVar2 != *pfVar1) || (bVar6 = bVar5, NAN(fVar2) || NAN(*pfVar1))) ||
              (fVar2 = *(float *)(lVar3 + lVar8 * 8), pfVar1 = (float *)(lVar4 + lVar8 * 8),
              fVar2 != *pfVar1)) || (NAN(fVar2) || NAN(*pfVar1))) goto LAB_0010b678;
          lVar8 = lVar8 + 1;
        } while (local_18 != lVar8);
        lVar7 = lVar7 + 1;
        lVar4 = lVar4 + local_18 * 8;
        lVar3 = lVar3 + local_18 * 8;
      } while (lVar7 != local_18);
    }
    bVar6 = true;
  }
  else {
    bVar6 = false;
  }
LAB_0010b678:
  if (local_10 != (void *)0x0) {
    operator_delete__(local_10);
  }
  if (local_20 != (void *)0x0) {
    operator_delete__(local_20);
  }
  return bVar6;
}

Assistant:

inline bool equals( const QObject< T >& other ) const override {
        return ( other.matrix() == matrix() ) ;
      }